

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

bool ModActorFlag(AActor *actor,FString *flagname,bool set,bool printerror)

{
  char *pcVar1;
  PClassActor *info;
  FFlagDef *pFVar2;
  long lVar3;
  uint uVar4;
  FString part1;
  
  if (actor == (AActor *)0x0) {
    return false;
  }
  pcVar1 = strchr(flagname->Chars,0x2e);
  info = (PClassActor *)DObject::GetClass((DObject *)actor);
  if (pcVar1 == (char *)0x0) {
    pFVar2 = FindFlag((PClass *)info,flagname->Chars,(char *)0x0,false);
  }
  else {
    FString::FString(&part1,flagname->Chars,(long)pcVar1 - (long)flagname->Chars);
    pFVar2 = FindFlag((PClass *)info,part1.Chars,pcVar1 + 1,false);
    FString::~FString(&part1);
  }
  if (pFVar2 == (FFlagDef *)0x0) {
    if (!printerror) {
      return false;
    }
    DPrintf(1,"ACS/DECORATE: \'%s\' is not a flag in \'%s\'\n",flagname->Chars,
            FName::NameData.NameArray
            [(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index]
            .Text);
    return false;
  }
  uVar4 = (actor->flags).Value;
  if (((uVar4 & 0x8400000) == 0x400000) && (0 < actor->health)) {
    level.total_monsters = level.total_monsters + -1;
  }
  if ((uVar4 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + -1;
  }
  if (((actor->flags5).Value & 0x10) != 0) {
    level.total_secrets = level.total_secrets + -1;
  }
  lVar3 = (long)pFVar2->structoffset;
  if (lVar3 == 0x1bc) {
    uVar4 = pFVar2->flagbit;
    part1.Chars = (char *)0x0;
    if ((uVar4 == 0x10) || (uVar4 == 8)) {
      AActor::UnlinkFromWorld(actor,(FLinkContext *)&part1);
      lVar3 = (long)pFVar2->structoffset;
      if (set) {
        uVar4 = pFVar2->flagbit |
                *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar3);
      }
      else {
        uVar4 = ~pFVar2->flagbit &
                *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar3);
      }
      *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar3) = uVar4;
      AActor::LinkToWorld(actor,(FLinkContext *)&part1,false,(sector_t *)0x0);
      goto LAB_00503234;
    }
  }
  else {
    if (pFVar2->structoffset == -1) {
      HandleDeprecatedFlags(actor,info,set,pFVar2->flagbit);
      goto LAB_00503234;
    }
    uVar4 = pFVar2->flagbit;
  }
  if (set) {
    uVar4 = uVar4 | *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar3);
  }
  else {
    uVar4 = ~uVar4 & *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar3);
  }
  *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar3) = uVar4;
LAB_00503234:
  uVar4 = (actor->flags).Value;
  if (((uVar4 & 0x8400000) == 0x400000) && (0 < actor->health)) {
    level.total_monsters = level.total_monsters + 1;
  }
  if ((uVar4 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + 1;
  }
  if (((actor->flags5).Value & 0x10) != 0) {
    level.total_secrets = level.total_secrets + 1;
    return true;
  }
  return true;
}

Assistant:

bool ModActorFlag(AActor *actor, FString &flagname, bool set, bool printerror)
{
	bool found = false;

	if (actor != NULL)
	{
		const char *dot = strchr(flagname, '.');
		FFlagDef *fd;
		PClassActor *cls = actor->GetClass();

		if (dot != NULL)
		{
			FString part1(flagname.GetChars(), dot - flagname);
			fd = FindFlag(cls, part1, dot + 1);
		}
		else
		{
			fd = FindFlag(cls, flagname, NULL);
		}

		if (fd != NULL)
		{
			found = true;

			if (actor->CountsAsKill() && actor->health > 0) --level.total_monsters;
			if (actor->flags & MF_COUNTITEM) --level.total_items;
			if (actor->flags5 & MF5_COUNTSECRET) --level.total_secrets;

			if (fd->structoffset == -1)
			{
				HandleDeprecatedFlags(actor, cls, set, fd->flagbit);
			}
			else
			{
				ActorFlags *flagp = (ActorFlags*)(((char*)actor) + fd->structoffset);

				// If these 2 flags get changed we need to update the blockmap and sector links.
				bool linkchange = flagp == &actor->flags && (fd->flagbit == MF_NOBLOCKMAP || fd->flagbit == MF_NOSECTOR);

				FLinkContext ctx;
				if (linkchange) actor->UnlinkFromWorld(&ctx);
				ModActorFlag(actor, fd, set);
				if (linkchange) actor->LinkToWorld(&ctx);
			}

			if (actor->CountsAsKill() && actor->health > 0) ++level.total_monsters;
			if (actor->flags & MF_COUNTITEM) ++level.total_items;
			if (actor->flags5 & MF5_COUNTSECRET) ++level.total_secrets;
		}
		else if (printerror)
		{
			DPrintf(DMSG_ERROR, "ACS/DECORATE: '%s' is not a flag in '%s'\n", flagname.GetChars(), cls->TypeName.GetChars());
		}
	}

	return found;
}